

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawListSharedData::ImDrawListSharedData(ImDrawListSharedData *this)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  
  auVar4 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])(this->CircleSegmentCounts + 0x28) = ZEXT1632(auVar4);
  *(undefined1 (*) [32])(this->CircleSegmentCounts + 0x10) = ZEXT1632(auVar4);
  auVar5 = ZEXT1632(auVar4);
  *(undefined1 (*) [32])(this->ArcFastVtx + 10) = auVar5;
  *(undefined1 (*) [32])(this->ArcFastVtx + 6) = auVar5;
  *(undefined1 (*) [32])(this->ArcFastVtx + 2) = auVar5;
  *(undefined1 (*) [32])&(this->ClipRectFullscreen).y = auVar5;
  auVar5 = ZEXT1632(auVar4);
  (this->TexUvWhitePixel).x = (float)(int)auVar5._0_8_;
  (this->TexUvWhitePixel).y = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
  this->Font = (ImFont *)auVar5._8_8_;
  this->FontSize = (float)auVar5._16_4_;
  this->CurveTessellationTol = (float)auVar5._20_4_;
  this->CircleSegmentMaxError = (float)auVar5._24_4_;
  (this->ClipRectFullscreen).x = (float)auVar5._28_4_;
  lVar1 = 0;
  do {
    fVar2 = (((float)(int)lVar1 + (float)(int)lVar1) * 3.1415927) / 12.0;
    fVar3 = cosf(fVar2);
    fVar2 = sinf(fVar2);
    this->ArcFastVtx[lVar1].x = fVar3;
    this->ArcFastVtx[lVar1].y = fVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xc);
  return;
}

Assistant:

ImDrawListSharedData::ImDrawListSharedData()
{
    memset(this, 0, sizeof(*this));
    for (int i = 0; i < IM_ARRAYSIZE(ArcFastVtx); i++)
    {
        const float a = ((float)i * 2 * IM_PI) / (float)IM_ARRAYSIZE(ArcFastVtx);
        ArcFastVtx[i] = ImVec2(ImCos(a), ImSin(a));
    }
}